

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemLauncher.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::SystemLauncher::getUnixCommandLine
          (SystemLauncher *this,string *commandLine,bool foreground)

{
  byte in_CL;
  string *in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *launch;
  
  if ((in_CL & 1) == 0) {
    ::std::operator+(in_RDI,in_RSI);
  }
  else {
    ::std::__cxx11::string::string((string *)in_RDI,in_RDX);
  }
  return in_RDI;
}

Assistant:

std::string SystemLauncher::getUnixCommandLine(const std::string& commandLine,
                                                   bool foreground) const
    {
        std::string launch = foreground ? commandLine : (commandLine + " &");

        return launch;
    }